

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

bool anon_unknown.dwarf_12f34a6::CheckGenExParameters
               (cmGeneratorExpressionContext *ctx,GeneratorExpressionContent *cnt,string_view genex,
               string_view option,size_t count,int required,bool exactly)

{
  char local_10a [2];
  char *local_108;
  char local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_68 [8];
  string nbParameters;
  bool exactly_local;
  GeneratorExpressionContent *cnt_local;
  cmGeneratorExpressionContext *ctx_local;
  string_view option_local;
  string_view genex_local;
  
  option_local._M_len = (size_t)option._M_str;
  ctx_local = (cmGeneratorExpressionContext *)option._M_len;
  option_local._M_str = (char *)genex._M_len;
  nbParameters.field_2._M_local_buf[0xf] = exactly;
  if (((int)count < required) || ((exactly && (required < (int)count)))) {
    std::__cxx11::string::string((string *)local_68);
    switch(required) {
    case 1:
      std::__cxx11::string::operator=((string *)local_68,"one parameter");
      break;
    case 2:
      std::__cxx11::string::operator=((string *)local_68,"two parameters");
      break;
    case 3:
      std::__cxx11::string::operator=((string *)local_68,"three parameters");
      break;
    case 4:
      std::__cxx11::string::operator=((string *)local_68,"four parameters");
      break;
    default:
      std::__cxx11::to_string(&local_b8,required);
      cmStrCat<std::__cxx11::string,char_const(&)[12]>(&local_98,&local_b8,(char (*) [12])0x10825e9)
      ;
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_d8,cnt);
    local_f9 = ':';
    local_108 = "at least";
    if ((nbParameters.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_108 = "exactly";
    }
    local_10a[1] = 0x20;
    local_10a[0] = '.';
    cmStrCat<char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&,char,std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[23],char_const*,char,std::__cxx11::string&,char>
              (&local_f8,(char (*) [3])0x10824b9,
               (basic_string_view<char,_std::char_traits<char>_> *)&option_local._M_str,&local_f9,
               (basic_string_view<char,_std::char_traits<char>_> *)&ctx_local,
               (char (*) [23])"> expression requires ",&local_108,local_10a + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               local_10a);
    reportError(ctx,&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    genex_local._M_str._7_1_ = false;
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    genex_local._M_str._7_1_ = true;
  }
  return genex_local._M_str._7_1_;
}

Assistant:

bool CheckGenExParameters(cmGeneratorExpressionContext* ctx,
                          const GeneratorExpressionContent* cnt,
                          cm::string_view genex, cm::string_view option,
                          std::size_t count, int required = 1,
                          bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    std::string nbParameters;
    switch (required) {
      case 1:
        nbParameters = "one parameter";
        break;
      case 2:
        nbParameters = "two parameters";
        break;
      case 3:
        nbParameters = "three parameters";
        break;
      case 4:
        nbParameters = "four parameters";
        break;
      default:
        nbParameters = cmStrCat(std::to_string(required), " parameters");
    }
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<", genex, ':', option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ', nbParameters,
                         '.'));
    return false;
  }
  return true;
}